

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_dirty_update_commit
               (filemgr *file,filemgr_dirty_update_node *commit_node,err_log_callback *log_callback)

{
  uint32_t uVar1;
  avl_node *paVar2;
  list_elem *e;
  avl_node *in_RDX;
  avl_tree *in_RSI;
  long in_RDI;
  list_elem *le;
  list remove_queue;
  filemgr_dirty_update_node *node;
  avl_node *a;
  memory_order in_stack_ffffffffffffffbc;
  err_log_callback *in_stack_ffffffffffffffc0;
  filemgr_dirty_update_node *in_stack_ffffffffffffffc8;
  filemgr *in_stack_ffffffffffffffd0;
  avl_node *local_20;
  
  list_init((list *)&stack0xffffffffffffffc8);
  if (in_RSI != (avl_tree *)0x0) {
    filemgr_dirty_update_flush
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x2d0));
  *(undefined8 *)(in_RDI + 0x2c8) = 0;
  paVar2 = avl_first((avl_tree *)(in_RDI + 0x2b0));
  while (local_20 = paVar2, local_20 != (avl_node *)0x0) {
    paVar2 = avl_next(local_20);
    if ((((ulong)local_20[1].left & 1) != 0) &&
       (uVar1 = atomic_get_uint32_t((atomic<unsigned_int> *)in_stack_ffffffffffffffc0,
                                    in_stack_ffffffffffffffbc), uVar1 == 0)) {
      avl_remove(in_RSI,in_RDX);
      list_push_front((list *)&stack0xffffffffffffffc8,(list_elem *)local_20);
    }
  }
  pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x2d0));
  e = list_begin((list *)&stack0xffffffffffffffc8);
  while (e != (list_elem *)0x0) {
    e = list_remove((list *)&stack0xffffffffffffffc8,e);
    _filemgr_dirty_update_remove_node(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void filemgr_dirty_update_commit(struct filemgr *file,
                                 struct filemgr_dirty_update_node *commit_node,
                                 err_log_callback *log_callback)
{
    struct avl_node *a;
    struct filemgr_dirty_update_node *node;
    struct list remove_queue;
    struct list_elem *le;

    // 1. write back all blocks in the given (committed) node
    // 2. remove all other immutable dirty update entries
    list_init(&remove_queue);
    if (commit_node) {
        filemgr_dirty_update_flush(file, commit_node, log_callback);
    }

    spin_lock(&file->dirty_update_lock);
    file->latest_dirty_update = NULL;

    a = avl_first(&file->dirty_update_idx);
    while (a) {
        node = _get_entry(a, struct filemgr_dirty_update_node, avl);
        a = avl_next(a);

        if (node->immutable &&
            atomic_get_uint32_t(&node->ref_count) == 0) {
            // detach from tree and insert into remove queue
            avl_remove(&file->dirty_update_idx, &node->avl);
            list_push_front(&remove_queue, &node->le);
        }
    }

    spin_unlock(&file->dirty_update_lock);

    le = list_begin(&remove_queue);
    while (le) {
        node = _get_entry(le, struct filemgr_dirty_update_node, le);
        le = list_remove(&remove_queue, &node->le);
        _filemgr_dirty_update_remove_node(file, node);
    }
}